

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.h
# Opt level: O0

char * Person::AccessLevel(int level)

{
  char *pcStack_10;
  int level_local;
  
  if (level == 1) {
    pcStack_10 = "Gray";
  }
  else if (level == 2) {
    pcStack_10 = "Green";
  }
  else if (level == 3) {
    pcStack_10 = "Yellow";
  }
  else if (level == 4) {
    pcStack_10 = "Red";
  }
  else {
    pcStack_10 = "non-level";
  }
  return pcStack_10;
}

Assistant:

static char* AccessLevel(int level){
        if(level == 1){
            return (char*)("Gray");
        }else if(level == 2){
            return (char*)("Green");
        }else if(level == 3){
            return (char*)("Yellow");
        }else if(level == 4){
            return (char*)("Red");
        }
        return (char*)"non-level";
    }